

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

size_t bundle_ring_length(ring_t *ring)

{
  ring_t *prVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  ring_t *prVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar2 = ring->len;
  prVar1 = ring + 1;
  uVar8 = 0x10;
  do {
    prVar5 = ring;
    uVar11 = uVar8;
    if ((uVar8 < uVar2) ||
       (uVar6 = 0, prVar5 = prVar1, uVar11 = uVar8 - uVar2, uVar8 - uVar2 < ring[1].len)) {
      uVar6 = (uint)(byte)prVar5->data[uVar11] << 0x18;
    }
    iVar3 = (int)uVar8;
    uVar11 = (ulong)(iVar3 + 1);
    uVar8 = uVar11;
    prVar5 = ring;
    if ((uVar11 < uVar2) ||
       (uVar9 = 0, uVar8 = uVar11 - uVar2, prVar5 = prVar1, uVar11 - uVar2 < ring[1].len)) {
      uVar9 = (uint)(byte)prVar5->data[uVar8] << 0x10;
    }
    uVar11 = (ulong)(iVar3 + 2);
    uVar8 = uVar11;
    prVar5 = ring;
    if ((uVar11 < uVar2) ||
       (uVar10 = 0, uVar8 = uVar11 - uVar2, prVar5 = prVar1, uVar11 - uVar2 < ring[1].len)) {
      uVar10 = (uint)(byte)prVar5->data[uVar8] << 8;
    }
    uVar11 = (ulong)(iVar3 + 3);
    prVar5 = ring;
    uVar8 = uVar11;
    if ((uVar11 < uVar2) ||
       (uVar12 = 0, prVar5 = prVar1, uVar8 = uVar11 - uVar2, uVar11 - uVar2 < ring[1].len)) {
      uVar12 = (uint)(byte)prVar5->data[uVar8];
    }
    uVar10 = uVar10 | uVar9 | uVar6;
    iVar7 = uVar10 + 4 + uVar12;
    if (uVar10 == 0 && uVar12 == 0) {
      iVar7 = 0;
    }
    uVar8 = (ulong)(uint)(iVar7 + iVar3);
  } while (uVar10 != 0 || uVar12 != 0);
  sVar4 = 0;
  if (uVar8 <= uVar2 + ring[1].len) {
    sVar4 = uVar8;
  }
  return sVar4;
}

Assistant:

static size_t bundle_ring_length(ring_t *ring)
{
    unsigned pos = 8+8;//goto first length field
    uint32_t advance = 0;
    do {
        advance = deref(pos+0, ring) << (8*3) |
                  deref(pos+1, ring) << (8*2) |
                  deref(pos+2, ring) << (8*1) |
                  deref(pos+3, ring) << (8*0);
        if(advance)
            pos += 4+advance;
    } while(advance);

    return pos <= (ring[0].len+ring[1].len) ? pos : 0;
}